

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

int __thiscall QSocks5SocketEngine::close(QSocks5SocketEngine *this,int __fd)

{
  long lVar1;
  QAbstractSocket *this_00;
  long *plVar2;
  char cVar3;
  SocketState SVar4;
  undefined4 uVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((*(undefined8 **)(lVar1 + 0xf8) != (undefined8 *)0x0) &&
     (this_00 = (QAbstractSocket *)**(undefined8 **)(lVar1 + 0xf8),
     this_00 != (QAbstractSocket *)0x0)) {
    SVar4 = QAbstractSocket::state(this_00);
    if (SVar4 == ConnectedState) {
      local_38 = 0;
      uStack_30 = 0x100000000;
      QDeadlineTimer::setPreciseRemainingTime((longlong)&local_38,0,100000000);
      do {
        lVar6 = (**(code **)(*(long *)**(undefined8 **)(lVar1 + 0xf8) + 0xa8))();
        if (lVar6 != 0) break;
        plVar2 = (long *)**(undefined8 **)(lVar1 + 0xf8);
        uVar5 = QDeadlineTimer::remainingTime();
        cVar3 = (**(code **)(*plVar2 + 0xc0))(plVar2,uVar5);
      } while (cVar3 != '\0');
    }
    (**(code **)(*(long *)**(undefined8 **)(lVar1 + 0xf8) + 0x70))();
  }
  *(undefined8 *)(lVar1 + 0xc4) = 0;
  if ((*(long *)(lVar1 + 0x108) != 0) &&
     (plVar2 = *(long **)(*(long *)(lVar1 + 0x108) + 0x10), plVar2 != (long *)0x0)) {
    (**(code **)(*plVar2 + 0x70))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QSocks5SocketEngine::close()
{
    QSOCKS5_Q_DEBUG << "close()";
    Q_D(QSocks5SocketEngine);
    if (d->data && d->data->controlSocket) {
        if (d->data->controlSocket->state() == QAbstractSocket::ConnectedState) {
            QDeadlineTimer deadline(100ms);
            while (!d->data->controlSocket->bytesToWrite()) {
               if (!d->data->controlSocket->waitForBytesWritten(deadline.remainingTime()))
                   break;
            }
        }
        d->data->controlSocket->close();
    }
    d->inboundStreamCount = d->outboundStreamCount = 0;
#ifndef QT_NO_UDPSOCKET
    if (d->udpData && d->udpData->udpSocket)
        d->udpData->udpSocket->close();
#endif
}